

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicTexImage2DCase::createTexture(BasicTexImage2DCase *this)

{
  ContextWrapper *this_00;
  int internalFormat;
  deUint32 type;
  TextureFormatInfo *minVal;
  Vec4 *maxVal;
  deUint32 dVar1;
  int height;
  int iVar2;
  int width;
  deUint32 tex;
  int local_d4;
  BasicTexImage2DCase *local_d0;
  TextureFormatInfo *local_c8;
  ContextWrapper *local_c0;
  Vec4 *local_b8;
  Random rnd;
  TextureLevel levelData;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_58;
  
  tex = 0;
  local_58.super_ConstPixelBufferAccess.m_format =
       glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel(&levelData,(TextureFormat *)&local_58);
  dVar1 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  local_c8 = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  local_b8 = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  local_d0 = this;
  local_c0 = this_00;
  for (iVar2 = 0; maxVal = local_b8, minVal = local_c8,
      iVar2 < (local_d0->super_Texture2DSpecCase).m_numLevels; iVar2 = iVar2 + 1) {
    width = (local_d0->super_Texture2DSpecCase).m_width >> ((byte)iVar2 & 0x1f);
    if (width < 2) {
      width = 1;
    }
    height = (local_d0->super_Texture2DSpecCase).m_height >> ((byte)iVar2 & 0x1f);
    if (height < 2) {
      height = 1;
    }
    local_d4 = iVar2;
    randomVector<4>((Functional *)&gMin,&rnd,&local_c8->valueMin,local_b8);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    tcu::TextureLevel::setSize(&levelData,width,height,1);
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    internalFormat = *(int *)&(local_d0->super_Texture2DSpecCase).field_0xd4;
    dVar1 = local_d0->m_format;
    type = local_d0->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&levelData);
    iVar2 = local_d4;
    sglr::ContextWrapper::glTexImage2D
              (local_c0,0xde1,local_d4,internalFormat,width,height,0,dVar1,type,
               local_58.super_ConstPixelBufferAccess.m_data);
  }
  tcu::TextureLevel::~TextureLevel(&levelData);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			levelData.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
		}
	}